

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O3

PatternType __thiscall
QMimeGlobPattern::detectPatternType(QMimeGlobPattern *this,QStringView pattern)

{
  bool bVar1;
  PatternType PVar2;
  qsizetype qVar3;
  ulong uVar4;
  ulong uVar5;
  QtPrivate *this_00;
  CaseSensitivity in_R8D;
  long in_FS_OFFSET;
  QStringView haystack;
  QStringView rhs;
  QStringView rhs_00;
  QLatin1StringView lhs;
  QLatin1StringView lhs_00;
  QStringView local_38;
  long local_28;
  
  local_38.m_data = pattern.m_data;
  this_00 = (QtPrivate *)pattern.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  PVar2 = OtherPattern;
  local_38.m_size = (qsizetype)this_00;
  if (this_00 == (QtPrivate *)0x0) goto LAB_004a4ab7;
  haystack.m_data = (storage_type_conflict *)0x2a;
  haystack.m_size = (qsizetype)local_38.m_data;
  qVar3 = QtPrivate::count(this_00,haystack,(QChar)0x1,in_R8D);
  uVar4 = QStringView::indexOf(&local_38,(QChar)0x5b,0,CaseSensitive);
  uVar5 = QStringView::indexOf(&local_38,(QChar)0x3f,0,CaseSensitive);
  if ((uVar5 & uVar4) == 0xffffffffffffffff) {
    if (qVar3 == 0) {
      PVar2 = LiteralPattern;
      goto LAB_004a4ab7;
    }
    if ((qVar3 == 1) &&
       ((PVar2 = SuffixPattern, *local_38.m_data == L'*' ||
        (PVar2 = PrefixPattern, local_38.m_data[(long)(this_00 + -1)] == L'*')))) goto LAB_004a4ab7;
  }
  if ((QtPrivate *)local_38.m_size == (QtPrivate *)0xc) {
    rhs_00.m_data = local_38.m_data;
    rhs_00.m_size = 0xc;
    lhs_00.m_data = "*.anim[1-9j]";
    lhs_00.m_size = 0xc;
    bVar1 = QtPrivate::equalStrings(lhs_00,rhs_00);
    PVar2 = bVar1 ^ OtherPattern;
  }
  else {
    PVar2 = OtherPattern;
    if ((QtPrivate *)local_38.m_size == (QtPrivate *)0x13) {
      rhs.m_data = local_38.m_data;
      rhs.m_size = 0x13;
      lhs.m_data = "[0-9][0-9][0-9].vdr";
      lhs.m_size = 0x13;
      bVar1 = QtPrivate::equalStrings(lhs,rhs);
      PVar2 = (uint)!bVar1 * 2 + VdrPattern;
    }
  }
LAB_004a4ab7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return PVar2;
}

Assistant:

QMimeGlobPattern::PatternType QMimeGlobPattern::detectPatternType(QStringView pattern) const
{
    const qsizetype patternLength = pattern.size();
    if (!patternLength)
        return OtherPattern;

    const qsizetype starCount = pattern.count(u'*');
    const bool hasSquareBracket = pattern.indexOf(u'[') != -1;
    const bool hasQuestionMark = pattern.indexOf(u'?') != -1;

    if (!hasSquareBracket && !hasQuestionMark) {
        if (starCount == 1) {
            // Patterns like "*~", "*.extension"
            if (pattern.at(0) == u'*')
                return SuffixPattern;
            // Patterns like "README*" (well this is currently the only one like that...)
            if (pattern.at(patternLength - 1) == u'*')
                return PrefixPattern;
        } else if (starCount == 0) {
            // Names without any wildcards like "README"
            return LiteralPattern;
        }
    }

    if (pattern == "[0-9][0-9][0-9].vdr"_L1)
        return VdrPattern;

    if (pattern == "*.anim[1-9j]"_L1)
        return AnimPattern;

    return OtherPattern;
}